

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

void __thiscall QTextDocumentPrivate::setModified(QTextDocumentPrivate *this,bool m)

{
  int iVar1;
  
  if (this->modified == m) {
    return;
  }
  this->modified = m;
  iVar1 = -1;
  if (!m) {
    iVar1 = this->undoState;
  }
  this->modifiedState = iVar1;
  QTextDocument::modificationChanged(*(QTextDocument **)&this->field_0x8,m);
  return;
}

Assistant:

void QTextDocumentPrivate::setModified(bool m)
{
    Q_Q(QTextDocument);
    if (m == modified)
        return;

    modified = m;
    if (!modified)
        modifiedState = undoState;
    else
        modifiedState = -1;

    emit q->modificationChanged(modified);
}